

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  u8 *puVar3;
  uint uVar4;
  u8 uVar5;
  ushort uVar6;
  u16 uVar7;
  ulong uVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  u8 *local_68;
  u8 *local_60;
  
  puVar3 = pPage->aData;
  uVar8 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar13 = pPage->pBt->usableSize;
  uVar9 = (uint)uVar1 + (uint)uVar2 * 2;
  if (uVar2 == 0) {
    uVar5 = (u8)(uVar13 >> 8);
  }
  else {
    uVar15 = 0;
    local_68 = (u8 *)0x0;
    local_60 = puVar3;
    uVar4 = uVar13;
    do {
      uVar6 = *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) << 8 |
              *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) >> 8;
      uVar10 = 0xd3a8;
      if ((uVar6 < uVar9) ||
         (uVar11 = (uint)uVar6, uVar11 != uVar13 - 4 && (int)(uVar13 - 4) <= (int)(uint)uVar6))
      goto LAB_00138d73;
      uVar7 = cellSizePtr(pPage,local_60 + uVar11);
      uVar12 = uVar4 - uVar7;
      uVar10 = 0xd3b4;
      if (((int)uVar12 < (int)uVar9) || ((int)uVar13 < (int)((uint)uVar6 + (uint)uVar7)))
      goto LAB_00138d73;
      *(ushort *)(puVar3 + uVar15 * 2 + (ulong)uVar1) = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
      if (local_68 == (u8 *)0x0) {
        if (uVar12 != uVar11) {
          local_68 = (u8 *)pPage->pBt->pPager->pTmpSpace;
          uVar6 = *(ushort *)(puVar3 + uVar8 + 5) << 8 | *(ushort *)(puVar3 + uVar8 + 5) >> 8;
          memcpy(local_68 + uVar6,puVar3 + uVar6,(long)(int)(uVar4 - uVar6));
          local_60 = local_68;
          goto LAB_00138cf7;
        }
        local_68 = (u8 *)0x0;
      }
      else {
LAB_00138cf7:
        memcpy(puVar3 + uVar12,local_60 + uVar11,(ulong)uVar7);
      }
      uVar15 = uVar15 + 1;
      uVar4 = uVar12;
    } while (uVar2 != uVar15);
    uVar5 = (u8)(uVar12 >> 8);
    uVar13 = uVar12;
  }
  puVar3[uVar8 + 5] = uVar5;
  puVar3[uVar8 + 6] = (u8)uVar13;
  (puVar3 + uVar8 + 1)[0] = '\0';
  (puVar3 + uVar8 + 1)[1] = '\0';
  puVar3[uVar8 + 7] = '\0';
  iVar14 = 0;
  memset(puVar3 + uVar9,0,(long)(int)(uVar13 - uVar9));
  uVar10 = 0xd3cd;
  if (uVar13 - uVar9 != (uint)pPage->nFree) {
LAB_00138d73:
    iVar14 = 0xb;
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar10,
                "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  }
  return iVar14;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &src[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}